

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_24;
  
  if (*(Descriptor **)(this + 0x18) != (Descriptor *)0x0) {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
  }
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_24);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_24);
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}